

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetInputRecordTest_Test::TestBody(Psbt_SetInputRecordTest_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  reference pvVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint *puVar9;
  size_type sVar10;
  char *pcVar11;
  reference pvVar12;
  char *in_R9;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  ByteData get_gval2;
  ByteData get_gval1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ByteData global_value2;
  ByteData global_key2;
  ByteData global_value1;
  ByteData global_key1;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  Transaction get_tx2;
  Transaction get_tx1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  KeyData get_val2;
  KeyData get_val1;
  Psbt psbt2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  AssertionResult gtest_ar;
  CfdException *except;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_val_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_key_bytes;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  string *in_stack_ffffffffffffead8;
  KeyData *in_stack_ffffffffffffeae0;
  undefined7 in_stack_ffffffffffffeae8;
  undefined1 in_stack_ffffffffffffeaef;
  allocator_type *in_stack_ffffffffffffeaf0;
  undefined7 in_stack_ffffffffffffeaf8;
  undefined1 in_stack_ffffffffffffeaff;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffeb00;
  undefined7 in_stack_ffffffffffffeb98;
  Psbt *in_stack_ffffffffffffeba0;
  AssertHelper local_1350;
  Message local_1348;
  string local_1340;
  AssertionResult local_1320;
  AssertHelper local_1310;
  Message local_1308;
  string local_1300;
  string local_12e0;
  AssertionResult local_12c0;
  AssertHelper local_12b0;
  Message local_12a8;
  string local_12a0;
  string local_1280;
  AssertionResult local_1260;
  AssertHelper local_1250;
  Message local_1248;
  size_type local_1240;
  undefined4 local_1234;
  AssertionResult local_1230;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1220;
  AssertHelper local_1208;
  Message local_1200;
  string local_11f8;
  string local_11d8;
  AssertionResult local_11b8;
  AssertHelper local_11a8;
  Message local_11a0;
  string local_1198;
  string local_1178;
  AssertionResult local_1158;
  ByteData local_1148;
  ByteData local_1130;
  ByteData local_1118 [6];
  string local_1080;
  AssertHelper local_1060;
  Message local_1058;
  undefined1 local_1049;
  AssertionResult local_1048;
  string local_1038;
  AssertHelper local_1018;
  Message local_1010;
  byte local_1001;
  AssertionResult local_1000;
  string local_ff0;
  AssertHelper local_fd0;
  Message local_fc8;
  undefined1 local_fb9;
  AssertionResult local_fb8;
  allocator local_fa1;
  string local_fa0;
  ByteData local_f80;
  allocator local_f61;
  string local_f60;
  allocator local_f39;
  string local_f38;
  ByteData local_f18;
  allocator local_ef9;
  string local_ef8;
  ByteData local_ed8;
  allocator local_eb9;
  string local_eb8;
  allocator local_e91;
  string local_e90;
  ByteData local_e70;
  AssertHelper local_e58;
  Message local_e50;
  string local_e48;
  AssertionResult local_e28;
  AssertHelper local_e18;
  Message local_e10;
  string local_e08;
  AssertionResult local_de8;
  Transaction local_dd8;
  Transaction local_d98;
  AssertHelper local_d58;
  Message local_d50;
  string local_d48;
  string local_d28;
  AssertionResult local_d08;
  AssertHelper local_cf8;
  Message local_cf0;
  string local_ce8;
  string local_cc8;
  AssertionResult local_ca8;
  KeyData local_c98;
  KeyData local_b48;
  ByteData local_9f8;
  Psbt local_9e0;
  AssertHelper local_960;
  Message local_958;
  string local_950;
  AssertionResult local_930;
  AssertHelper local_920;
  Message local_918;
  ByteData local_910;
  string local_8f8;
  AssertionResult local_8d8 [3];
  Transaction local_8a0;
  ByteData local_860;
  allocator local_841;
  string local_840;
  ByteData local_820;
  allocator local_801;
  string local_800;
  ByteData local_7e0;
  allocator local_7c1;
  string local_7c0;
  ByteData local_7a0 [2];
  allocator local_759;
  string local_758;
  ByteData local_738;
  allocator local_719;
  string local_718;
  ByteData local_6f8;
  allocator local_6d9;
  string local_6d8;
  ByteData local_6b8;
  allocator local_699;
  string local_698;
  ByteData local_678;
  Transaction local_660;
  ByteData local_620;
  allocator local_601;
  string local_600;
  ByteData local_5e0;
  ByteData local_5c8;
  ByteData local_5b0;
  ByteData local_598;
  ByteData local_580;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_568;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_550;
  ByteData local_538;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_520;
  ByteData local_508;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4f0;
  Pubkey local_4d8;
  ByteData local_4c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4a8;
  Pubkey local_490;
  ByteData local_478;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_460;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_448;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  KeyData local_410;
  KeyData local_2c0;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  ByteData local_120;
  HDWallet local_108;
  ByteData local_f0;
  HDWallet local_d8;
  allocator local_a9;
  string local_a8 [32];
  Psbt local_88;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_a9);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::ByteData::ByteData(&local_f0,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa34d);
  cfd::core::ByteData::ByteData(&local_120,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa387);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"44h/0h/0h/1/1",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"44h/0h/0h/0/1",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData(&local_2c0,&local_d8,kTestnet,&local_140);
  cfd::core::HDWallet::GeneratePubkeyData(&local_410,&local_108,kTestnet,&local_168);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2aa464);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffeb00,CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
             ,in_stack_ffffffffffffeaf0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2aa48d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa49a);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_428,0);
  *pvVar6 = '\x06';
  cfd::core::KeyData::GetPubkey(&local_490,&local_2c0);
  cfd::core::Pubkey::GetData(&local_478,&local_490);
  cfd::core::ByteData::GetBytes(&local_460,&local_478);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa500);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2aa50d);
  cfd::core::KeyData::GetPubkey(&local_4d8,&local_410);
  cfd::core::Pubkey::GetData(&local_4c0,&local_4d8);
  cfd::core::ByteData::GetBytes(&local_4a8,&local_4c0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa55f);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2aa56c);
  cfd::core::KeyData::GetFingerprint(&local_508,&local_2c0);
  cfd::core::ByteData::GetBytes(&local_4f0,&local_508);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa5a7);
  cfd::core::KeyData::GetFingerprint(&local_538,&local_410);
  cfd::core::ByteData::GetBytes(&local_520,&local_538);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa5e2);
  cfd::core::KeyData::GetChildNumArray(&local_550,&local_2c0);
  cfd::core::KeyData::GetChildNumArray(&local_568,&local_410);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_428,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa637);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_550);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffeb00,CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa68f);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa6a4);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa6c0);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2aa6e1);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_550);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_580,&local_428);
  cfd::core::ByteData::ByteData(&local_598,&local_448);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_428,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa767);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_568);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffeb00,CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa7bf);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa7d4);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2aa7f0);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2aa811);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_568);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_5b0,&local_428);
  cfd::core::ByteData::ByteData(&local_5c8,&local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"00",&local_601);
  cfd::core::ByteData::ByteData(&local_5e0,&local_600);
  cfd::core::Transaction::Transaction(&local_660,&g_psbt_utxo_witness_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData(&local_620,&local_660.super_AbstractTransaction);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_5e0,&local_620);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa915);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aa92f);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"01",&local_699);
  cfd::core::ByteData::ByteData(&local_678,&local_698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6d8,"00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"
             ,&local_6d9);
  cfd::core::ByteData::ByteData(&local_6b8,&local_6d8);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_678,&local_6b8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aaa0b);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aaa32);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_718,"03",&local_719);
  cfd::core::ByteData::ByteData(&local_6f8,&local_718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"01000000",&local_759);
  cfd::core::ByteData::ByteData(&local_738,&local_758);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_6f8,&local_738);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aab0e);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  cfd::core::ByteData::~ByteData((ByteData *)0x2aab35);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c0,"04",&local_7c1);
  cfd::core::ByteData::ByteData(local_7a0,&local_7c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_800,"0014962c4e08f336d3afbc3415c9d359ae1040470520",&local_801);
  cfd::core::ByteData::ByteData(&local_7e0,&local_800);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,local_7a0,&local_7e0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ab328);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ab34f);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_580,&local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_840,"00",&local_841);
  cfd::core::ByteData::ByteData(&local_820,&local_840);
  cfd::core::Transaction::Transaction(&local_8a0,&g_psbt_utxo_legacy_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData(&local_860,&local_8a0.super_AbstractTransaction);
  cfd::core::Psbt::SetTxInRecord(&local_88,1,&local_820,&local_860);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ab432);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ab44c);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  cfd::core::Psbt::SetTxInRecord(&local_88,1,&local_5b0,&local_5c8);
  cfd::core::Psbt::GetData(&local_910,&local_88);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_8f8,&local_910);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8d8,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_8f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ab862);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(local_8d8);
  if (!bVar4) {
    testing::Message::Message(&local_918);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2ab924);
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x574,pcVar11);
    testing::internal::AssertHelper::operator=(&local_920,&local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::Message::~Message((Message *)0x2ab987);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ab9df);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_950,&local_88);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_930,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_950);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_930);
  if (!bVar4) {
    testing::Message::Message(&local_958);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2abacc);
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x575,pcVar11);
    testing::internal::AssertHelper::operator=(&local_960,&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    testing::Message::~Message((Message *)0x2abb2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2abb87);
  cfd::core::Psbt::GetData(&local_9f8,&local_88);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffeae0,(ByteData *)in_stack_ffffffffffffead8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2abbc2);
  cfd::core::Psbt::GetTxInKeyData(&local_b48,&local_9e0,0,false);
  cfd::core::Psbt::GetTxInKeyData(&local_c98,&local_9e0,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_cc8,&local_b48,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_ce8,&local_2c0,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_cc8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_ca8);
  if (!bVar4) {
    testing::Message::Message(&local_cf0);
    in_stack_ffffffffffffeba0 =
         (Psbt *)testing::AssertionResult::failure_message((AssertionResult *)0x2abdb2);
    testing::internal::AssertHelper::AssertHelper
              (&local_cf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x57a,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=(&local_cf8,&local_cf0);
    testing::internal::AssertHelper::~AssertHelper(&local_cf8);
    testing::Message::~Message((Message *)0x2abe15);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2abe6d);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_d28,&local_c98,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_(&local_d48,&local_410,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_d28);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_d08);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_d50);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2abfb0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x57b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    testing::Message::~Message((Message *)0x2ac013);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ac06b);
  cfd::core::Psbt::GetTxInUtxoFull(&local_d98,&local_9e0,0,false,(bool *)0x0);
  cfd::core::Psbt::GetTxInUtxoFull(&local_dd8,&local_9e0,1,false,(bool *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_e08,&local_d98.super_AbstractTransaction)
  ;
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_e08);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_de8);
  if (!bVar4) {
    testing::Message::Message(&local_e10);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2ac1c4);
    testing::internal::AssertHelper::AssertHelper
              (&local_e18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x57f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
    testing::internal::AssertHelper::~AssertHelper(&local_e18);
    testing::Message::~Message((Message *)0x2ac227);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ac27f);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_e48,&local_dd8.super_AbstractTransaction)
  ;
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_e48);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_e28);
  if (!bVar4) {
    testing::Message::Message(&local_e50);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2ac364);
    testing::internal::AssertHelper::AssertHelper
              (&local_e58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x580,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e58,&local_e50);
    testing::internal::AssertHelper::~AssertHelper(&local_e58);
    testing::Message::~Message((Message *)0x2ac3c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ac41f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e90,"cfd",&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_eb8,"dummy1",&local_eb9);
  cfd::core::Psbt::CreateRecordKey(&local_e70,0xfc,&local_e90,'\0',&local_eb8);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ef8,"01020304",&local_ef9);
  cfd::core::ByteData::ByteData(&local_ed8,&local_ef8);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f38,"cfd",&local_f39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f60,"dummy2",&local_f61);
  cfd::core::Psbt::CreateRecordKey(&local_f18,0xfc,&local_f38,'\0',&local_f60);
  std::__cxx11::string::~string((string *)&local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  std::__cxx11::string::~string((string *)&local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fa0,"00",&local_fa1);
  cfd::core::ByteData::ByteData(&local_f80,&local_fa0);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_e70,&local_ed8);
  local_fb9 = cfd::core::Psbt::IsFindTxInRecord(&local_88,0,&local_e70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeae0,(bool *)in_stack_ffffffffffffead8,
             (type *)0x2ac6b9);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_fb8);
  if (!bVar4) {
    testing::Message::Message(&local_fc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ff0,(internal *)&local_fb8,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x587,pcVar11);
    testing::internal::AssertHelper::operator=(&local_fd0,&local_fc8);
    testing::internal::AssertHelper::~AssertHelper(&local_fd0);
    std::__cxx11::string::~string((string *)&local_ff0);
    testing::Message::~Message((Message *)0x2ac951);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ac9c9);
  bVar4 = cfd::core::Psbt::IsFindTxInRecord(&local_88,0,&local_f18);
  local_1001 = ~bVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeae0,(bool *)in_stack_ffffffffffffead8,
             (type *)0x2aca0e);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1000);
  if (!bVar4) {
    testing::Message::Message(&local_1010);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1038,(internal *)&local_1000,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x588,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    testing::Message::~Message((Message *)0x2acb06);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2acb81);
  cfd::core::Psbt::SetTxInRecord(&local_88,0,&local_f18,&local_f80);
  local_1049 = cfd::core::Psbt::IsFindTxInRecord(&local_88,0,&local_f18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeae0,(bool *)in_stack_ffffffffffffead8,
             (type *)0x2acbe5);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1048);
  if (!bVar4) {
    testing::Message::Message(&local_1058);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1080,(internal *)&local_1048,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1060,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x58a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1060,&local_1058);
    testing::internal::AssertHelper::~AssertHelper(&local_1060);
    std::__cxx11::string::~string((string *)&local_1080);
    testing::Message::~Message((Message *)0x2accdd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2acd58);
  cfd::core::Psbt::GetData(local_1118,&local_88);
  cfd::Psbt::Psbt((Psbt *)in_stack_ffffffffffffeae0,(ByteData *)in_stack_ffffffffffffead8);
  cfd::Psbt::operator=(in_stack_ffffffffffffeba0,(Psbt *)CONCAT17(uVar5,in_stack_ffffffffffffeb98));
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2acdb7);
  cfd::core::Psbt::GetTxInRecord(&local_1130,&local_9e0,0,&local_e70);
  cfd::core::Psbt::GetTxInRecord(&local_1148,&local_9e0,0,&local_f18);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1178,&local_1130);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1198,&local_ed8);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_1198);
  std::__cxx11::string::~string((string *)&local_1178);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1158);
  if (!bVar4) {
    testing::Message::Message(&local_11a0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2acf9e);
    testing::internal::AssertHelper::AssertHelper
              (&local_11a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x58f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper(&local_11a8);
    testing::Message::~Message((Message *)0x2acffb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ad053);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_11d8,&local_1148);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_11f8,&local_f80);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::__cxx11::string::~string((string *)&local_11d8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_11b8);
  if (!bVar4) {
    testing::Message::Message(&local_1200);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2ad17a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x590,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1208,&local_1200);
    testing::internal::AssertHelper::~AssertHelper(&local_1208);
    testing::Message::~Message((Message *)0x2ad1d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ad22f);
  cfd::core::Psbt::GetTxInRecordKeyList(&local_1220,&local_9e0,0);
  local_1234 = 2;
  local_1240 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1220);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (int *)CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (unsigned_long *)in_stack_ffffffffffffeae0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1230);
  if (!bVar4) {
    testing::Message::Message(&local_1248);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2ad317);
    testing::internal::AssertHelper::AssertHelper
              (&local_1250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x593,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1250,&local_1248);
    testing::internal::AssertHelper::~AssertHelper(&local_1250);
    testing::Message::~Message((Message *)0x2ad374);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ad3cc);
  sVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1220)
  ;
  if (sVar10 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1280,&local_e70);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&local_1220,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_12a0,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
               (char *)in_stack_ffffffffffffeaf0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeae0);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::__cxx11::string::~string((string *)&local_1280);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1260);
    if (!bVar4) {
      testing::Message::Message(&local_12a8);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2ad516);
      testing::internal::AssertHelper::AssertHelper
                (&local_12b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
                 ,0x595,pcVar11);
      testing::internal::AssertHelper::operator=(&local_12b0,&local_12a8);
      testing::internal::AssertHelper::~AssertHelper(&local_12b0);
      testing::Message::~Message((Message *)0x2ad573);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ad5cb);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_12e0,&local_f18);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        (&local_1220,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1300,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
               (char *)in_stack_ffffffffffffeaf0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeae0);
    std::__cxx11::string::~string((string *)&local_1300);
    std::__cxx11::string::~string((string *)&local_12e0);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_12c0);
    if (!bVar4) {
      testing::Message::Message(&local_1308);
      in_stack_ffffffffffffeaf0 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x2ad6ff);
      testing::internal::AssertHelper::AssertHelper
                (&local_1310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
                 ,0x596,(char *)in_stack_ffffffffffffeaf0);
      testing::internal::AssertHelper::operator=(&local_1310,&local_1308);
      testing::internal::AssertHelper::~AssertHelper(&local_1310);
      testing::Message::~Message((Message *)0x2ad75c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ad7b1);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1340,&local_9e0);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1320,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_1340);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1320);
  if (!bVar4) {
    testing::Message::Message(&local_1348);
    in_stack_ffffffffffffeae0 =
         (KeyData *)testing::AssertionResult::failure_message((AssertionResult *)0x2ad89a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_psbt.cpp"
               ,0x598,(char *)in_stack_ffffffffffffeae0);
    testing::internal::AssertHelper::operator=(&local_1350,&local_1348);
    testing::internal::AssertHelper::~AssertHelper(&local_1350);
    testing::Message::~Message((Message *)0x2ad8f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ad94f);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_ffffffffffffeaf0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad969);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad976);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad983);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad990);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad99d);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad9aa);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ad9f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ada05);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ada12);
  cfd::core::ByteData::~ByteData((ByteData *)0x2ada1f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2adac8);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2adad5);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeae0);
  return;
}

Assistant:

TEST(Psbt, SetInputRecordTest) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);

  std::vector<uint8_t> txin_key_bytes(34);
  std::vector<uint8_t> txin_val_bytes;
  txin_key_bytes[0] = 6;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txin_key_bytes[1], pk_bytes1.data(), 33);
  txin_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txin_val_bytes.data(), fp1.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txin_key_bytes);
  ByteData txout_value1 = ByteData(txin_val_bytes);

  memcpy(&txin_key_bytes[1], pk_bytes2.data(), 33);
  txin_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txin_val_bytes.data(), fp2.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txin_key_bytes);
  ByteData txout_value2 = ByteData(txin_val_bytes);

  psbt.SetTxInRecord(0, ByteData("00"), Transaction(g_psbt_utxo_witness).GetData());
  try {
    psbt.SetTxInRecord(0, ByteData("01"), ByteData("00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"));
    psbt.SetTxInRecord(0, ByteData("03"), ByteData("01000000"));
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  psbt.SetTxInRecord(0, ByteData("04"), ByteData("0014962c4e08f336d3afbc3415c9d359ae1040470520"));
  psbt.SetTxInRecord(0, txout_key1, txout_value1);

  try {
    psbt.SetTxInRecord(1, ByteData("00"), Transaction(g_psbt_utxo_legacy).GetData());
    psbt.SetTxInRecord(1, txout_key2, txout_value2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxInKeyData(0);
  auto get_val2 = psbt2.GetTxInKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  auto get_tx1 = psbt2.GetTxInUtxoFull(0);
  auto get_tx2 = psbt2.GetTxInUtxoFull(1);
  EXPECT_EQ(get_tx1.GetHex(), g_psbt_utxo_witness);
  EXPECT_EQ(get_tx2.GetHex(), g_psbt_utxo_legacy);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxInRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxInRecord(0, global_key2));
  psbt.SetTxInRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxInRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxInRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxInRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA", psbt2.GetBase64().c_str());
}